

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int iso9660_options(archive_write *a,char *key,char *value)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t n;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  char *in_R8;
  char *in_R9;
  int num;
  int local_2c;
  
  pvVar1 = a->format_data;
  iVar2 = -0x14;
  switch(*key) {
  case 'a':
    iVar2 = strcmp(key,"abstract-file");
    if (iVar2 == 0) {
      iVar2 = get_str_opt(a,(archive_string *)((long)pvVar1 + 0x1a0),0x25,key,value);
      uVar3 = (uint)(iVar2 == 0);
      uVar5 = *(uint *)((long)pvVar1 + 0x10370) & 0xfffffffe;
      goto LAB_00418368;
    }
    iVar2 = strcmp(key,"application-id");
    if (iVar2 == 0) {
      iVar2 = get_str_opt(a,(archive_string *)((long)pvVar1 + 0x170),0x80,key,value);
      iVar4 = (*(uint *)((long)pvVar1 + 0x10370) & 0xfffffffd) + (uint)(iVar2 == 0) * 2;
      goto LAB_004182da;
    }
    iVar2 = strcmp(key,"allow-vernum");
    if (iVar2 != 0) {
      return -0x14;
    }
    uVar3 = (*(uint *)((long)pvVar1 + 0x10370) & 0xfffffffb) + (uint)(value != (char *)0x0) * 4;
    break;
  case 'b':
    iVar2 = strcmp(key,"biblio-file");
    if (iVar2 == 0) {
      iVar2 = get_str_opt(a,(archive_string *)((long)pvVar1 + 0x1b8),0x25,key,value);
      iVar4 = (*(uint *)((long)pvVar1 + 0x10370) & 0xfffffff7) + (uint)(iVar2 == 0) * 8;
LAB_004182da:
      *(int *)((long)pvVar1 + 0x10370) = iVar4;
      return iVar2;
    }
    iVar2 = strcmp(key,"boot");
    if (iVar2 == 0) {
      if (value != (char *)0x0) {
        *(uint *)((long)pvVar1 + 0x10370) = *(uint *)((long)pvVar1 + 0x10370) | 0x10;
        *(undefined8 *)((long)pvVar1 + 0x10330) = 0;
        n = strlen(value);
        archive_strncat((archive_string *)((long)pvVar1 + 0x10328),value,n);
        goto LAB_004184c9;
      }
      uVar3 = *(uint *)((long)pvVar1 + 0x10370) & 0xffffffef;
      break;
    }
    iVar2 = strcmp(key,"boot-catalog");
    if (iVar2 == 0) {
      iVar2 = get_str_opt(a,(archive_string *)((long)pvVar1 + 0x10308),0x400,key,value);
      uVar3 = (uint)(iVar2 == 0) << 5;
      uVar5 = *(uint *)((long)pvVar1 + 0x10370) & 0xffffffdf;
      goto LAB_00418368;
    }
    iVar2 = strcmp(key,"boot-info-table");
    if (iVar2 == 0) {
      uVar3 = (uint)(value != (char *)0x0) << 6;
      uVar5 = *(uint *)((long)pvVar1 + 0x10370) & 0xffffffbf;
      goto LAB_0041829e;
    }
    iVar2 = strcmp(key,"boot-load-seg");
    if (iVar2 != 0) {
      iVar2 = strcmp(key,"boot-load-size");
      if (iVar2 == 0) {
        local_2c = 0;
        iVar2 = get_num_opt(a,&local_2c,(int)key,(int)value,in_R8,in_R9);
        *(uint *)((long)pvVar1 + 0x10370) =
             *(uint *)((long)pvVar1 + 0x10370) & 0xfffffeff | (uint)(iVar2 == 0) << 8;
        if (iVar2 != 0) {
          return -0x1e;
        }
        *(undefined2 *)((long)pvVar1 + 0x1036c) = (undefined2)local_2c;
        goto LAB_004184c9;
      }
      iVar2 = strcmp(key,"boot-type");
      if (iVar2 != 0) {
        return -0x14;
      }
      if (value == (char *)0x0) goto LAB_004184cd;
      iVar2 = strcmp(value,"no-emulation");
      if (iVar2 == 0) {
        uVar3 = *(uint *)((long)pvVar1 + 0x10370) & 0xfffff9ff | 0x200;
      }
      else {
        if (((*value != 'f') || (value[1] != 'd')) || (value[2] != '\0')) {
          iVar2 = strcmp(value,"hard-disk");
          if (iVar2 != 0) goto LAB_004184cd;
          *(byte *)((long)pvVar1 + 0x10371) = *(byte *)((long)pvVar1 + 0x10371) | 6;
          goto LAB_004184c9;
        }
        uVar3 = *(uint *)((long)pvVar1 + 0x10370) & 0xfffff9ff | 0x400;
      }
      break;
    }
    uVar3 = *(uint *)((long)pvVar1 + 0x10370);
    *(uint *)((long)pvVar1 + 0x10370) = uVar3 & 0xffffff7f;
    if (value == (char *)0x0) goto LAB_004184cd;
    bVar6 = *value;
    if (bVar6 == 0x30) {
      if ((byte)(value[1] | 0x20U) == 0x78) {
        bVar6 = value[2];
        value = value + 2;
        goto LAB_004183fb;
      }
      bVar6 = 0x30;
LAB_0041846e:
      uVar5 = 0;
      do {
        value = (char *)((byte *)value + 1);
        if ((byte)(bVar6 + 0xbf) < 6) {
          uVar7 = bVar6 - 0x37;
        }
        else if ((byte)(bVar6 + 0x9f) < 6) {
          uVar7 = bVar6 - 0x57;
        }
        else {
          if (9 < (byte)(bVar6 - 0x30)) goto LAB_004184cd;
          uVar7 = (uint)(byte)(bVar6 - 0x30);
        }
        uVar5 = uVar5 * 0x10 + uVar7;
        if (0xffff < uVar5) {
          archive_set_error(&a->archive,-1,"Invalid value(over 0xffff) for option ``%s\'\'",key);
          return -0x1e;
        }
        bVar6 = *value;
      } while (bVar6 != 0);
    }
    else {
LAB_004183fb:
      if (bVar6 != 0) goto LAB_0041846e;
      uVar5 = 0;
    }
    *(short *)((long)pvVar1 + 0x1036a) = (short)uVar5;
    uVar3 = uVar3 | 0x80;
    break;
  case 'c':
    iVar2 = strcmp(key,"compression-level");
    if (iVar2 != 0) {
      iVar2 = strcmp(key,"copyright-file");
      if (iVar2 != 0) {
        return -0x14;
      }
      iVar2 = get_str_opt(a,(archive_string *)((long)pvVar1 + 0x188),0x25,key,value);
      uVar3 = (uint)(iVar2 == 0) << 0xc;
      uVar5 = 0xffffefff;
      goto LAB_00417faf;
    }
    if (((value == (char *)0x0) || (9 < (byte)(*value - 0x30U))) || (value[1] != '\0'))
    goto LAB_004184cd;
    *(uint *)((long)pvVar1 + 0x2c8) = (uint)(byte)(*value - 0x30U);
    *(byte *)((long)pvVar1 + 0x10371) = *(byte *)((long)pvVar1 + 0x10371) | 8;
    goto LAB_004184c9;
  case 'd':
  case 'e':
  case 'f':
  case 'g':
  case 'h':
  case 'k':
  case 'm':
  case 'n':
  case 'o':
  case 'q':
  case 's':
  case 't':
  case 'u':
    goto switchD_00417dbe_caseD_64;
  case 'i':
    iVar2 = strcmp(key,"iso-level");
    if (iVar2 != 0) {
      return -0x14;
    }
    if (((value == (char *)0x0) || (value[1] != '\0')) || (3 < (byte)(*value - 0x31U))) {
LAB_004184cd:
      archive_set_error(&a->archive,-1,"Invalid value for option ``%s\'\'",key);
      return -0x19;
    }
    uVar5 = *(uint *)((long)pvVar1 + 0x10370) & 0xfffe3fff | ((byte)*value & 7) << 0xe;
    goto LAB_004182a0;
  case 'j':
    iVar2 = strcmp(key,"joliet");
    if (iVar2 != 0) {
      return -0x14;
    }
    if (value == (char *)0x0) {
      *(byte *)((long)pvVar1 + 0x10372) = *(byte *)((long)pvVar1 + 0x10372) & 0xf9;
      goto LAB_004184c9;
    }
    if ((*value == '1') && (value[1] == '\0')) {
      uVar3 = *(uint *)((long)pvVar1 + 0x10370) & 0xfff9ffff | 0x20000;
    }
    else {
      iVar2 = strcmp(value,"long");
      if (iVar2 != 0) goto LAB_004184cd;
      uVar3 = *(uint *)((long)pvVar1 + 0x10370) & 0xfff9ffff | 0x40000;
    }
    break;
  case 'l':
    iVar2 = strcmp(key,"limit-depth");
    if (iVar2 == 0) {
      uVar5 = *(uint *)((long)pvVar1 + 0x10370) & 0xfff7ffff;
      uVar3 = (uint)(value != (char *)0x0) << 0x13;
    }
    else {
      iVar2 = strcmp(key,"limit-dirs");
      if (iVar2 != 0) {
        return -0x14;
      }
      uVar5 = *(uint *)((long)pvVar1 + 0x10370) & 0xffefffff;
      uVar3 = (uint)(value != (char *)0x0) << 0x14;
    }
    goto LAB_0041829e;
  case 'p':
    iVar2 = strcmp(key,"pad");
    if (iVar2 != 0) {
      iVar2 = strcmp(key,"publisher");
      if (iVar2 != 0) {
        return -0x14;
      }
      iVar2 = get_str_opt(a,(archive_string *)((long)pvVar1 + 0x140),0x80,key,value);
      uVar3 = (uint)(iVar2 == 0) << 0x16;
      uVar5 = 0xffbfffff;
      goto LAB_00417faf;
    }
    uVar5 = *(uint *)((long)pvVar1 + 0x10370) & 0xffdfffff;
    uVar3 = (uint)(value != (char *)0x0) << 0x15;
LAB_0041829e:
    uVar5 = uVar5 | uVar3;
LAB_004182a0:
    *(uint *)((long)pvVar1 + 0x10370) = uVar5;
    goto LAB_004184c9;
  case 'r':
    iVar2 = strcmp(key,"rockridge");
    if ((iVar2 != 0) && (iVar2 = strcmp(key,"Rockridge"), iVar2 != 0)) {
      return -0x14;
    }
    if (value == (char *)0x0) {
      *(uint *)((long)pvVar1 + 0x10370) = *(uint *)((long)pvVar1 + 0x10370) & 0xfe7fffff;
      goto LAB_004184c9;
    }
    if ((*value != '1') || (value[1] != '\0')) {
      iVar2 = strcmp(value,"strict");
      if (iVar2 == 0) {
        uVar3 = *(uint *)((long)pvVar1 + 0x10370) & 0xfe7fffff | 0x800000;
        break;
      }
      iVar2 = strcmp(value,"useful");
      if (iVar2 != 0) goto LAB_004184cd;
    }
    uVar3 = *(uint *)((long)pvVar1 + 0x10370) & 0xfe7fffff | 0x1000000;
    break;
  case 'v':
    iVar2 = strcmp(key,"volume-id");
    if (iVar2 != 0) {
      return -0x14;
    }
    iVar2 = get_str_opt(a,(archive_string *)((long)pvVar1 + 0x128),0x20,key,value);
    uVar3 = (uint)(iVar2 == 0) << 0x19;
    uVar5 = 0xfdffffff;
LAB_00417faf:
    uVar5 = uVar5 & *(uint *)((long)pvVar1 + 0x10370);
LAB_00418368:
    *(uint *)((long)pvVar1 + 0x10370) = uVar5 | uVar3;
    return iVar2;
  default:
    if (*key != 'z') {
      return -0x14;
    }
    iVar2 = strcmp(key,"zisofs");
    if (iVar2 != 0) {
      return -0x14;
    }
    if (value == (char *)0x0) {
      uVar3 = *(uint *)((long)pvVar1 + 0x10370) & 0xfbffffff;
    }
    else {
      uVar3 = *(uint *)((long)pvVar1 + 0x10370) | 0x4000000;
    }
  }
  *(uint *)((long)pvVar1 + 0x10370) = uVar3;
LAB_004184c9:
  iVar2 = 0;
switchD_00417dbe_caseD_64:
  return iVar2;
}

Assistant:

static int
iso9660_options(struct archive_write *a, const char *key, const char *value)
{
	struct iso9660 *iso9660 = a->format_data;
	const char *p;
	int r;

	switch (key[0]) {
	case 'a':
		if (strcmp(key, "abstract-file") == 0) {
			r = get_str_opt(a,
			    &(iso9660->abstract_file_identifier),
			    ABSTRACT_FILE_SIZE, key, value);
			iso9660->opt.abstract_file = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "application-id") == 0) {
			r = get_str_opt(a,
			    &(iso9660->application_identifier),
			    APPLICATION_IDENTIFIER_SIZE, key, value);
			iso9660->opt.application_id = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "allow-vernum") == 0) {
			iso9660->opt.allow_vernum = value != NULL;
			return (ARCHIVE_OK);
		}
		break;
	case 'b':
		if (strcmp(key, "biblio-file") == 0) {
			r = get_str_opt(a,
			    &(iso9660->bibliographic_file_identifier),
			    BIBLIO_FILE_SIZE, key, value);
			iso9660->opt.biblio_file = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "boot") == 0) {
			if (value == NULL)
				iso9660->opt.boot = 0;
			else {
				iso9660->opt.boot = 1;
				archive_strcpy(
				    &(iso9660->el_torito.boot_filename),
				    value);
			}
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-catalog") == 0) {
			r = get_str_opt(a,
			    &(iso9660->el_torito.catalog_filename),
			    1024, key, value);
			iso9660->opt.boot_catalog = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "boot-info-table") == 0) {
			iso9660->opt.boot_info_table = value != NULL;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-load-seg") == 0) {
			uint32_t seg;

			iso9660->opt.boot_load_seg = 0;
			if (value == NULL)
				goto invalid_value;
			seg = 0;
			p = value;
			if (p[0] == '0' && (p[1] == 'x' || p[1] == 'X'))
				p += 2;
			while (*p) {
				if (seg)
					seg <<= 4;
				if (*p >= 'A' && *p <= 'F')
					seg += *p - 'A' + 0x0a;
				else if (*p >= 'a' && *p <= 'f')
					seg += *p - 'a' + 0x0a;
				else if (*p >= '0' && *p <= '9')
					seg += *p - '0';
				else
					goto invalid_value;
				if (seg > 0xffff) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Invalid value(over 0xffff) for "
					    "option ``%s''", key);
					return (ARCHIVE_FATAL);
				}
				p++;
			}
			iso9660->el_torito.boot_load_seg = (uint16_t)seg;
			iso9660->opt.boot_load_seg = 1;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-load-size") == 0) {
			int num = 0;
			r = get_num_opt(a, &num, 0xffff, 1, key, value);
			iso9660->opt.boot_load_size = r == ARCHIVE_OK;
			if (r != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			iso9660->el_torito.boot_load_size = (uint16_t)num;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-type") == 0) {
			if (value == NULL)
				goto invalid_value;
			if (strcmp(value, "no-emulation") == 0)
				iso9660->opt.boot_type = OPT_BOOT_TYPE_NO_EMU;
			else if (strcmp(value, "fd") == 0)
				iso9660->opt.boot_type = OPT_BOOT_TYPE_FD;
			else if (strcmp(value, "hard-disk") == 0)
				iso9660->opt.boot_type = OPT_BOOT_TYPE_HARD_DISK;
			else
				goto invalid_value;
			return (ARCHIVE_OK);
		}
		break;
	case 'c':
		if (strcmp(key, "compression-level") == 0) {
#ifdef HAVE_ZLIB_H
			if (value == NULL ||
			    !(value[0] >= '0' && value[0] <= '9') ||
			    value[1] != '\0')
				goto invalid_value;
                	iso9660->zisofs.compression_level = value[0] - '0';
			iso9660->opt.compression_level = 1;
                	return (ARCHIVE_OK);
#else
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Option ``%s'' "
			    "is not supported on this platform.", key);
			return (ARCHIVE_FATAL);
#endif
		}
		if (strcmp(key, "copyright-file") == 0) {
			r = get_str_opt(a,
			    &(iso9660->copyright_file_identifier),
			    COPYRIGHT_FILE_SIZE, key, value);
			iso9660->opt.copyright_file = r == ARCHIVE_OK;
			return (r);
		}
#ifdef DEBUG
		/* Specifies Volume creation date and time;
		 * year(4),month(2),day(2),hour(2),minute(2),second(2).
		 * e.g. "20090929033757"
		 */
		if (strcmp(key, "creation") == 0) {
			struct tm tm;
			char buf[5];

			p = value;
			if (p == NULL || strlen(p) < 14)
				goto invalid_value;
			memset(&tm, 0, sizeof(tm));
			memcpy(buf, p, 4); buf[4] = '\0'; p += 4;
			tm.tm_year = strtol(buf, NULL, 10) - 1900;
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_mon = strtol(buf, NULL, 10) - 1;
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_mday = strtol(buf, NULL, 10);
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_hour = strtol(buf, NULL, 10);
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_min = strtol(buf, NULL, 10);
			memcpy(buf, p, 2); buf[2] = '\0';
			tm.tm_sec = strtol(buf, NULL, 10);
			iso9660->birth_time = mktime(&tm);
			return (ARCHIVE_OK);
		}
#endif
		break;
	case 'i':
		if (strcmp(key, "iso-level") == 0) {
			if (value != NULL && value[1] == '\0' &&
			    (value[0] >= '1' && value[0] <= '4')) {
				iso9660->opt.iso_level = value[0]-'0';
				return (ARCHIVE_OK);
			}
			goto invalid_value;
		}
		break;
	case 'j':
		if (strcmp(key, "joliet") == 0) {
			if (value == NULL)
				iso9660->opt.joliet = OPT_JOLIET_DISABLE;
			else if (strcmp(value, "1") == 0)
				iso9660->opt.joliet = OPT_JOLIET_ENABLE;
			else if (strcmp(value, "long") == 0)
				iso9660->opt.joliet = OPT_JOLIET_LONGNAME;
			else
				goto invalid_value;
			return (ARCHIVE_OK);
		}
		break;
	case 'l':
		if (strcmp(key, "limit-depth") == 0) {
			iso9660->opt.limit_depth = value != NULL;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "limit-dirs") == 0) {
			iso9660->opt.limit_dirs = value != NULL;
			return (ARCHIVE_OK);
		}
		break;
	case 'p':
		if (strcmp(key, "pad") == 0) {
			iso9660->opt.pad = value != NULL;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "publisher") == 0) {
			r = get_str_opt(a,
			    &(iso9660->publisher_identifier),
			    PUBLISHER_IDENTIFIER_SIZE, key, value);
			iso9660->opt.publisher = r == ARCHIVE_OK;
			return (r);
		}
		break;
	case 'r':
		if (strcmp(key, "rockridge") == 0 ||
		    strcmp(key, "Rockridge") == 0) {
			if (value == NULL)
				iso9660->opt.rr = OPT_RR_DISABLED;
			else if (strcmp(value, "1") == 0)
				iso9660->opt.rr = OPT_RR_USEFUL;
			else if (strcmp(value, "strict") == 0)
				iso9660->opt.rr = OPT_RR_STRICT;
			else if (strcmp(value, "useful") == 0)
				iso9660->opt.rr = OPT_RR_USEFUL;
			else
				goto invalid_value;
			return (ARCHIVE_OK);
		}
		break;
	case 'v':
		if (strcmp(key, "volume-id") == 0) {
			r = get_str_opt(a, &(iso9660->volume_identifier),
			    VOLUME_IDENTIFIER_SIZE, key, value);
			iso9660->opt.volume_id = r == ARCHIVE_OK;
			return (r);
		}
		break;
	case 'z':
		if (strcmp(key, "zisofs") == 0) {
			if (value == NULL)
				iso9660->opt.zisofs = OPT_ZISOFS_DISABLED;
			else {
#ifdef HAVE_ZLIB_H
				iso9660->opt.zisofs = OPT_ZISOFS_DIRECT;
#else
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "``zisofs'' "
				    "is not supported on this platform.");
				return (ARCHIVE_FATAL);
#endif
			}
			return (ARCHIVE_OK);
		}
		break;
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);

invalid_value:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "Invalid value for option ``%s''", key);
	return (ARCHIVE_FAILED);
}